

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void write_io(Emulator *e,MaskedAddress addr,u8 value)

{
  byte bVar1;
  ushort uVar2;
  byte bVar3;
  Address AVar4;
  Bool BVar5;
  Bool BVar6;
  HdmaTransferMode HVar7;
  RGBA RVar8;
  Palette *pPVar9;
  bool bVar10;
  ColorPalettes *local_90;
  ColorPalettes *local_88;
  DmaState local_7c;
  bool local_77;
  bool local_76;
  RGBA color;
  u16 color16;
  u8 color_index;
  u8 palette_index;
  ColorPalettes *cp_1;
  ColorPalettes *cp;
  u8 new_blocks;
  HdmaTransferMode new_mode;
  Palette *pal;
  PaletteType type;
  Bool y_compare;
  Bool vblank;
  Bool hblank;
  Bool new_hblank_irq;
  Bool new_vblank_irq;
  Bool was_enabled;
  u16 tima_mask;
  Bool tima_tick;
  u16 old_tima_mask;
  Bool old_timer_on;
  u8 value_local;
  MaskedAddress addr_local;
  Emulator *e_local;
  
  switch(addr) {
  case 0:
    (e->state).joyp.joypad_select = (int)(uint)value >> 4 & JOYPAD_SELECT_NONE;
    do_sgb(e);
    check_joyp_intr(e);
    break;
  case 1:
    serial_synchronize(e);
    (e->state).serial.sb = value;
    break;
  case 2:
    serial_synchronize(e);
    (e->state).serial.transferring = (int)(uint)value >> 7;
    (e->state).serial.clock = value & SERIAL_CLOCK_INTERNAL;
    if ((e->state).serial.transferring != FALSE) {
      (e->state).serial.tick_count = 0;
      (e->state).serial.transferred_bits = '\0';
    }
    calculate_next_serial_intr(e);
    break;
  default:
    break;
  case 4:
    timer_synchronize(e);
    clear_div(e);
    calculate_next_timer_intr(e);
    break;
  case 5:
    timer_synchronize(e);
    if ((e->state).timer.on == FALSE) {
      (e->state).timer.tima = value;
    }
    else {
      if ((e->state).timer.tima_state == TIMA_STATE_OVERFLOW) {
        (e->state).timer.tima_state = TIMA_STATE_NORMAL;
        (e->state).interrupt.new_if = (e->state).interrupt.new_if & 0xfb;
        (e->state).timer.tima = value;
      }
      else if ((e->state).timer.tima_state != TIMA_STATE_RESET) {
        (e->state).timer.tima = value;
      }
      calculate_next_timer_intr(e);
    }
    break;
  case 6:
    timer_synchronize(e);
    (e->state).timer.tma = value;
    bVar10 = false;
    if ((e->state).timer.on != FALSE) {
      bVar10 = (e->state).timer.tima_state == TIMA_STATE_RESET;
    }
    if (bVar10) {
      (e->state).timer.tima = value;
    }
    calculate_next_timer_intr(e);
    break;
  case 7:
    timer_synchronize(e);
    BVar5 = (e->state).timer.on;
    uVar2 = s_tima_mask[(e->state).timer.clock_select];
    (e->state).timer.clock_select = value & TIMER_CLOCK_16384_HZ;
    (e->state).timer.on = (int)(uint)value >> 2 & TRUE;
    if (BVar5 == FALSE) {
      if ((e->state).timer.on == FALSE) {
        bVar10 = false;
        if (((e->state).timer.div_counter & uVar2) != 0) {
          bVar10 = ((e->state).timer.div_counter & s_tima_mask[(e->state).timer.clock_select]) == 0;
        }
      }
      else {
        bVar10 = ((e->state).timer.div_counter & uVar2) != 0;
      }
      if (bVar10) {
        increment_tima(e);
      }
    }
    calculate_next_timer_intr(e);
    break;
  case 0xf:
    intr_synchronize(e);
    (e->state).interrupt.if_ = value & 0x1f;
    (e->state).interrupt.new_if = value & 0x1f;
    break;
  case 0x40:
    ppu_synchronize(e);
    ppu_mode3_synchronize(e);
    BVar5 = (e->state).ppu.lcdc.display;
    (e->state).ppu.lcdc.display = (int)(uint)value >> 7;
    (e->state).ppu.lcdc.window_tile_map_select = (int)(uint)value >> 6 & TILE_MAP_9C00_9FFF;
    (e->state).ppu.lcdc.window_display = (int)(uint)value >> 5 & TRUE;
    (e->state).ppu.lcdc.bg_tile_data_select = (int)(uint)value >> 4 & TILE_DATA_8000_8FFF;
    (e->state).ppu.lcdc.bg_tile_map_select = (int)(uint)value >> 3 & TILE_MAP_9C00_9FFF;
    (e->state).ppu.lcdc.obj_size = (int)(uint)value >> 2 & OBJ_SIZE_8X16;
    (e->state).ppu.lcdc.obj_display = (int)(uint)value >> 1 & TRUE;
    (e->state).ppu.lcdc.bg_display = value & TRUE;
    if (BVar5 != (e->state).ppu.lcdc.display) {
      (e->state).ppu.stat.mode = PPU_MODE_HBLANK;
      (e->state).ppu.line_y = '\0';
      (e->state).ppu.ly = '\0';
      if ((e->state).ppu.lcdc.display == FALSE) {
        if ((e->state).is_sgb == FALSE) {
          clear_frame_buffer(e,0xffffffff);
        }
        else {
          update_sgb_mask(e);
        }
        (e->state).event = (e->state).event | 1;
      }
      else {
        check_ly_eq_lyc(e,FALSE);
        (e->state).ppu.state = PPU_STATE_LCD_ON_MODE2;
        (e->state).ppu.state_ticks = 0x50;
        (e->state).ppu.line_start_ticks = (e->state).ticks - 5 & 0xfffffffffffffffc;
        (e->state).ppu.display_delay_frames = '\x04';
        (e->state).ppu.stat.trigger_mode = PPU_MODE_MODE2;
      }
      calculate_next_ppu_intr(e);
    }
    break;
  case 0x41:
    ppu_synchronize(e);
    BVar5 = (int)(uint)value >> 4 & TRUE;
    BVar6 = (int)(uint)value >> 3 & TRUE;
    if ((e->state).ppu.lcdc.display != FALSE) {
      local_76 = false;
      if ((e->state).ppu.stat.trigger_mode == PPU_MODE_HBLANK) {
        local_76 = (e->state).ppu.stat.hblank.irq == FALSE;
      }
      local_77 = false;
      if ((e->state).ppu.stat.trigger_mode == PPU_MODE_VBLANK) {
        local_77 = (e->state).ppu.stat.vblank.irq == FALSE;
      }
      bVar10 = false;
      if ((e->state).ppu.stat.new_ly_eq_lyc != FALSE) {
        bVar10 = (e->state).ppu.stat.y_compare.irq == FALSE;
      }
      if ((e->state).is_cgb != FALSE) {
        local_76 = local_76 && BVar6 != FALSE;
        local_77 = local_77 && BVar5 != FALSE;
      }
      if (((e->state).ppu.stat.if_ == FALSE) && (((local_76 || (local_77)) || (bVar10)))) {
        (e->state).interrupt.new_if = (e->state).interrupt.new_if | 2;
        (e->state).interrupt.if_ = (e->state).interrupt.if_ | 2;
        (e->state).ppu.stat.if_ = TRUE;
      }
    }
    (e->state).ppu.stat.y_compare.irq = (int)(uint)value >> 6 & TRUE;
    (e->state).ppu.stat.mode2.irq = (int)(uint)value >> 5 & TRUE;
    (e->state).ppu.stat.vblank.irq = BVar5;
    (e->state).ppu.stat.hblank.irq = BVar6;
    calculate_next_ppu_intr(e);
    break;
  case 0x42:
    ppu_mode3_synchronize(e);
    (e->state).ppu.scy = value;
    break;
  case 0x43:
    ppu_synchronize(e);
    ppu_mode3_synchronize(e);
    (e->state).ppu.scx = value;
    break;
  case 0x44:
    break;
  case 0x45:
    ppu_synchronize(e);
    (e->state).ppu.lyc = value;
    if ((e->state).ppu.lcdc.display != FALSE) {
      check_ly_eq_lyc(e,TRUE);
      check_stat(e);
    }
    calculate_next_ppu_intr(e);
    break;
  case 0x46:
    dma_synchronize(e);
    (e->state).dma.sync_ticks = (e->state).ticks;
    (e->state).dma.tick_count = 0;
    if ((e->state).dma.state == DMA_INACTIVE) {
      local_7c = DMA_TRIGGERED;
    }
    else {
      local_7c = (e->state).dma.state;
    }
    (e->state).dma.state = local_7c;
    (e->state).dma.source = (ushort)value << 8;
    break;
  case 0x47:
  case 0x48:
  case 0x49:
    pPVar9 = (e->state).ppu.pal + (addr - 0x47);
    ppu_mode3_synchronize(e);
    pPVar9->color[3] = (int)(uint)value >> 6;
    pPVar9->color[2] = (int)(uint)value >> 4 & COLOR_BLACK;
    pPVar9->color[1] = (int)(uint)value >> 2 & COLOR_BLACK;
    pPVar9->color[0] = value & COLOR_BLACK;
    update_bw_palette_rgba(e,addr - 0x47);
    break;
  case 0x4a:
    ppu_synchronize(e);
    ppu_mode3_synchronize(e);
    (e->state).ppu.wy = value;
    break;
  case 0x4b:
    ppu_mode3_synchronize(e);
    (e->state).ppu.wx = value;
    break;
  case 0x4d:
    if ((e->state).is_cgb != FALSE) {
      (e->state).cpu_speed.switching = value & TRUE;
    }
    break;
  case 0x4f:
    if ((e->state).is_cgb != FALSE) {
      (e->state).vram.bank = value & 1;
      (e->state).vram.offset = (ushort)(e->state).vram.bank << 0xd;
    }
    break;
  case 0x51:
    if ((e->state).is_cgb != FALSE) {
      (e->state).hdma.source = (e->state).hdma.source & 0xff | (ushort)value << 8;
    }
    break;
  case 0x52:
    if ((e->state).is_cgb != FALSE) {
      (e->state).hdma.source = (e->state).hdma.source & 0xff00 | value & 0xf0;
    }
    break;
  case 0x53:
    if ((e->state).is_cgb != FALSE) {
      (e->state).hdma.dest = (e->state).hdma.dest & 0xff | (ushort)value << 8;
    }
    break;
  case 0x54:
    if ((e->state).is_cgb != FALSE) {
      (e->state).hdma.dest = (e->state).hdma.dest & 0xff00 | value & 0xf0;
    }
    break;
  case 0x55:
    if ((e->state).is_cgb != FALSE) {
      HVar7 = (int)(uint)value >> 7;
      bVar3 = value & 0x7f;
      if (((e->state).hdma.mode == HDMA_TRANSFER_MODE_HDMA) &&
         (((e->state).hdma.blocks & 0x80) == 0)) {
        if (HVar7 == HDMA_TRANSFER_MODE_GDMA) {
          (e->state).hdma.blocks = (e->state).hdma.blocks | bVar3 | 0x80;
        }
        else {
          (e->state).hdma.blocks = bVar3;
          (e->state).hdma.mode = HVar7;
        }
      }
      else {
        (e->state).hdma.mode = HVar7;
        (e->state).hdma.blocks = bVar3;
      }
      if ((e->state).hdma.mode == HDMA_TRANSFER_MODE_GDMA) {
        (e->state).hdma.state = DMA_ACTIVE;
      }
    }
    break;
  case 0x56:
    if ((e->state).is_cgb != FALSE) {
      (e->state).infrared.write = value & TRUE;
      (e->state).infrared.enabled = (int)(uint)value >> 6;
    }
    break;
  case 0x68:
  case 0x6a:
    if ((e->state).is_cgb != FALSE) {
      ppu_mode3_synchronize(e);
      if (addr == 0x68) {
        local_88 = &(e->state).ppu.bgcp;
      }
      else {
        local_88 = &(e->state).ppu.obcp;
      }
      local_88->index = value & 0x3f;
      local_88->auto_increment = (int)(uint)value >> 7;
    }
    break;
  case 0x69:
  case 0x6b:
    if ((e->state).is_cgb != FALSE) {
      ppu_mode3_synchronize(e);
      if (addr == 0x69) {
        local_90 = &(e->state).ppu.bgcp;
      }
      else {
        local_90 = &(e->state).ppu.obcp;
      }
      local_90->data[local_90->index] = value;
      bVar3 = local_90->index;
      bVar1 = local_90->index;
      RVar8 = unpack_cgb_color(e,CONCAT11(local_90->data[(int)(local_90->index | 1)],
                                          local_90->data[(int)(local_90->index & 0xfffffffe)]));
      local_90->palettes[(byte)((int)(uint)bVar3 >> 3) & 7].color[(byte)((int)(uint)bVar1 >> 1) & 3]
           = RVar8;
      if (local_90->auto_increment != FALSE) {
        local_90->index = local_90->index + 1 & 0x3f;
      }
    }
    break;
  case 0x70:
    if ((e->state).is_cgb != FALSE) {
      (e->state).wram.bank = value & 7;
      if ((e->state).wram.bank == '\0') {
        AVar4 = 0x1000;
      }
      else {
        AVar4 = (ushort)(e->state).wram.bank << 0xc;
      }
      (e->state).wram.offset = AVar4;
    }
    break;
  case 0xff:
    (e->state).interrupt.ie = value;
  }
  return;
}

Assistant:

static void write_io(Emulator* e, MaskedAddress addr, u8 value) {
  HOOK(write_io_asb, addr, get_io_reg_string(addr), value);
  switch (addr) {
    case IO_JOYP_ADDR:
      JOYP.joypad_select = UNPACK(value, JOYP_JOYPAD_SELECT);
      do_sgb(e);
      check_joyp_intr(e);
      break;
    case IO_SB_ADDR:
      serial_synchronize(e);
      SERIAL.sb = value;
#if RGBDS_LIVE
      EM_ASM({emulator.serialCallback($0);}, value);
#endif
      break;
    case IO_SC_ADDR:
      serial_synchronize(e);
      SERIAL.transferring = UNPACK(value, SC_TRANSFER_START);
      SERIAL.clock = UNPACK(value, SC_SHIFT_CLOCK);
      if (SERIAL.transferring) {
        SERIAL.tick_count = 0;
        SERIAL.transferred_bits = 0;
      }
      calculate_next_serial_intr(e);
      break;
    case IO_DIV_ADDR:
      timer_synchronize(e);
      clear_div(e);
      calculate_next_timer_intr(e);
      break;
    case IO_TIMA_ADDR:
      timer_synchronize(e);
      if (TIMER.on) {
        if (UNLIKELY(TIMER.tima_state == TIMA_STATE_OVERFLOW)) {
          /* Cancel the overflow and interrupt if written on the same tick. */
          TIMER.tima_state = TIMA_STATE_NORMAL;
          INTR.new_if &= ~IF_TIMER;
          TIMER.tima = value;
        } else if (TIMER.tima_state != TIMA_STATE_RESET) {
          /* Only update tima if it wasn't reset this tick. */
          TIMER.tima = value;
        }
        calculate_next_timer_intr(e);
      } else {
        TIMER.tima = value;
      }
      break;
    case IO_TMA_ADDR:
      timer_synchronize(e);
      TIMER.tma = value;
      if (UNLIKELY(TIMER.on && TIMER.tima_state == TIMA_STATE_RESET)) {
        TIMER.tima = value;
      }
      calculate_next_timer_intr(e);
      break;
    case IO_TAC_ADDR: {
      timer_synchronize(e);
      Bool old_timer_on = TIMER.on;
      u16 old_tima_mask = s_tima_mask[TIMER.clock_select];
      TIMER.clock_select = UNPACK(value, TAC_CLOCK_SELECT);
      TIMER.on = UNPACK(value, TAC_TIMER_ON);
      /* tima is incremented when a specific bit of div_counter transitions
       * from 1 to 0. This can happen as a result of writing to DIV, or in this
       * case modifying which bit we're looking at. */
      Bool tima_tick = FALSE;
      if (!old_timer_on) {
        u16 tima_mask = s_tima_mask[TIMER.clock_select];
        if (TIMER.on) {
          tima_tick = (TIMER.div_counter & old_tima_mask) != 0;
        } else {
          tima_tick = (TIMER.div_counter & old_tima_mask) != 0 &&
                      (TIMER.div_counter & tima_mask) == 0;
        }
        if (tima_tick) {
          increment_tima(e);
        }
      }
      calculate_next_timer_intr(e);
      break;
    }
    case IO_IF_ADDR:
      intr_synchronize(e);
      INTR.new_if = INTR.if_ = value & IF_ALL;
      break;
    case IO_LCDC_ADDR: {
      ppu_synchronize(e);
      ppu_mode3_synchronize(e);
      Bool was_enabled = LCDC.display;
      LCDC.display = UNPACK(value, LCDC_DISPLAY);
      LCDC.window_tile_map_select = UNPACK(value, LCDC_WINDOW_TILE_MAP_SELECT);
      LCDC.window_display = UNPACK(value, LCDC_WINDOW_DISPLAY);
      LCDC.bg_tile_data_select = UNPACK(value, LCDC_BG_TILE_DATA_SELECT);
      LCDC.bg_tile_map_select = UNPACK(value, LCDC_BG_TILE_MAP_SELECT);
      LCDC.obj_size = UNPACK(value, LCDC_OBJ_SIZE);
      LCDC.obj_display = UNPACK(value, LCDC_OBJ_DISPLAY);
      LCDC.bg_display = UNPACK(value, LCDC_BG_DISPLAY);
      if (was_enabled ^ LCDC.display) {
        STAT.mode = PPU_MODE_HBLANK;
        PPU.ly = PPU.line_y = 0;
        if (LCDC.display) {
          check_ly_eq_lyc(e, FALSE);
          HOOK0(enable_display_v);
          PPU.state = PPU_STATE_LCD_ON_MODE2;
          PPU.state_ticks = PPU_MODE2_TICKS;
          PPU.line_start_ticks =
              ALIGN_UP(TICKS - CPU_TICK - CPU_TICK, CPU_TICK);
          PPU.display_delay_frames = PPU_ENABLE_DISPLAY_DELAY_FRAMES;
          STAT.trigger_mode = PPU_MODE_MODE2;
        } else {
          HOOK0(disable_display_v);
          /* Clear the framebuffer. */
          if (IS_SGB) {
            update_sgb_mask(e);
          } else {
            clear_frame_buffer(e, RGBA_WHITE);
          }
          e->state.event |= EMULATOR_EVENT_NEW_FRAME;
        }
        calculate_next_ppu_intr(e);
      }
      break;
    }
    case IO_STAT_ADDR: {
      ppu_synchronize(e);
      Bool new_vblank_irq = UNPACK(value, STAT_VBLANK_INTR);
      Bool new_hblank_irq = UNPACK(value, STAT_HBLANK_INTR);
      if (LCDC.display) {
        Bool hblank = TRIGGER_MODE_IS(HBLANK) && !STAT.hblank.irq;
        Bool vblank = TRIGGER_MODE_IS(VBLANK) && !STAT.vblank.irq;
        Bool y_compare = STAT.new_ly_eq_lyc && !STAT.y_compare.irq;
        if (IS_CGB) {
          /* CGB only triggers on STAT write if the value being written
           * actually sets that IRQ */
          hblank = hblank && new_hblank_irq;
          vblank = vblank && new_vblank_irq;
        }
        if (!STAT.if_ && (hblank || vblank || y_compare)) {
          HOOK(trigger_stat_from_write_cccii, y_compare ? 'Y' : '.',
               vblank ? 'V' : '.', hblank ? 'H' : '.', PPU.ly,
               TICKS + CPU_TICK);
          INTR.new_if |= IF_STAT;
          INTR.if_ |= IF_STAT;
          STAT.if_ = TRUE;
        }
      }
      STAT.y_compare.irq = UNPACK(value, STAT_YCOMPARE_INTR);
      STAT.mode2.irq = UNPACK(value, STAT_MODE2_INTR);
      STAT.vblank.irq = new_vblank_irq;
      STAT.hblank.irq = new_hblank_irq;
      calculate_next_ppu_intr(e);
      break;
    }
    case IO_SCY_ADDR:
      ppu_mode3_synchronize(e);
      PPU.scy = value;
      break;
    case IO_SCX_ADDR:
      ppu_synchronize(e);
      ppu_mode3_synchronize(e);
      PPU.scx = value;
      break;
    case IO_LY_ADDR:
      break;
    case IO_LYC_ADDR:
      ppu_synchronize(e);
      PPU.lyc = value;
      if (LCDC.display) {
        check_ly_eq_lyc(e, TRUE);
        check_stat(e);
      }
      calculate_next_ppu_intr(e);
      break;
    case IO_DMA_ADDR:
      /* DMA can be restarted. */
      dma_synchronize(e);
      DMA.sync_ticks = TICKS;
      DMA.tick_count = 0;
      DMA.state = (DMA.state != DMA_INACTIVE ? DMA.state : DMA_TRIGGERED);
      DMA.source = value << 8;
      break;
    case IO_BGP_ADDR:
    case IO_OBP0_ADDR:
    case IO_OBP1_ADDR: {
      PaletteType type = addr - IO_BGP_ADDR;
      Palette* pal = &PPU.pal[type];
      ppu_mode3_synchronize(e);
      pal->color[3] = UNPACK(value, PALETTE_COLOR3);
      pal->color[2] = UNPACK(value, PALETTE_COLOR2);
      pal->color[1] = UNPACK(value, PALETTE_COLOR1);
      pal->color[0] = UNPACK(value, PALETTE_COLOR0);
      update_bw_palette_rgba(e, type);
      break;
    }
    case IO_WY_ADDR:
      ppu_synchronize(e);
      ppu_mode3_synchronize(e);
      PPU.wy = value;
      break;
    case IO_WX_ADDR:
      ppu_mode3_synchronize(e);
      PPU.wx = value;
      break;
    case IO_KEY1_ADDR:
      if (IS_CGB) {
        CPU_SPEED.switching = UNPACK(value, KEY1_PREPARE_SPEED_SWITCH);
      }
      break;
    case IO_VBK_ADDR:
      if (IS_CGB) {
        VRAM.bank = UNPACK(value, VBK_VRAM_BANK);
        VRAM.offset = VRAM.bank << 13;
      }
      break;
    case IO_HDMA1_ADDR:
      if (IS_CGB) {
        HDMA.source = (HDMA.source & 0x00ff) | (value << 8);
      }
      break;
    case IO_HDMA2_ADDR:
      if (IS_CGB) {
        HDMA.source = (HDMA.source & 0xff00) | (value & 0xf0);
      }
      break;
    case IO_HDMA3_ADDR:
      if (IS_CGB) {
        HDMA.dest = (HDMA.dest & 0x00ff) | (value << 8);
      }
      break;
    case IO_HDMA4_ADDR:
      if (IS_CGB) {
        HDMA.dest = (HDMA.dest & 0xff00) | (value & 0xf0);
      }
      break;
    case IO_HDMA5_ADDR:
      if (IS_CGB) {
        HdmaTransferMode new_mode = UNPACK(value, HDMA5_TRANSFER_MODE);
        u8 new_blocks = UNPACK(value, HDMA5_BLOCKS);
        if (HDMA.mode == HDMA_TRANSFER_MODE_HDMA &&
            (HDMA.blocks & 0x80) == 0) { /* HDMA Active */
          if (new_mode == HDMA_TRANSFER_MODE_GDMA) {
            /* Stop HDMA copy. */
            HDMA.blocks |= 0x80 | new_blocks;
          } else {
            HDMA.blocks = new_blocks;
            HDMA.mode = new_mode;
          }
        } else {
          HDMA.mode = new_mode;
          HDMA.blocks = new_blocks;
        }
        if (HDMA.mode == HDMA_TRANSFER_MODE_GDMA) {
          HDMA.state = DMA_ACTIVE;
        }
      }
      break;
    case IO_RP_ADDR:
      if (IS_CGB) {
        INFRARED.write = UNPACK(value, RP_WRITE_DATA);
        INFRARED.enabled = UNPACK(value, RP_DATA_READ_ENABLE);
      }
      break;
    case IO_BCPS_ADDR:
    case IO_OCPS_ADDR:
      if (IS_CGB) {
        ppu_mode3_synchronize(e);
        ColorPalettes* cp = addr == IO_BCPS_ADDR ? &PPU.bgcp : &PPU.obcp;
        cp->index = UNPACK(value, XCPS_INDEX);
        cp->auto_increment = UNPACK(value, XCPS_AUTO_INCREMENT);
      }
      break;
    case IO_BCPD_ADDR:
    case IO_OCPD_ADDR:
      if (IS_CGB) {
        ppu_mode3_synchronize(e);
        ColorPalettes* cp = addr == IO_BCPD_ADDR ? &PPU.bgcp : &PPU.obcp;
        cp->data[cp->index] = value;
        u8 palette_index = (cp->index >> 3) & 7;
        u8 color_index = (cp->index >> 1) & 3;
        u16 color16 = (cp->data[cp->index | 1] << 8) | cp->data[cp->index & ~1];
        RGBA color = unpack_cgb_color(e, color16);
        cp->palettes[palette_index].color[color_index] = color;
        if (cp->auto_increment) {
          cp->index = (cp->index + 1) & 0x3f;
        }
      }
      break;
    case IO_SVBK_ADDR:
      if (IS_CGB) {
        WRAM.bank = UNPACK(value, SVBK_WRAM_BANK);
        WRAM.offset = WRAM.bank == 0 ? 0x1000 : (WRAM.bank << 12);
      }
      break;
    case IO_IE_ADDR:
      INTR.ie = value;
      break;
    default:
      HOOK(write_io_ignored_as, addr, get_io_reg_string(addr), value);
      break;
  }
}